

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockAddr.cpp
# Opt level: O3

void AGSSock::SockAddr_set_Address(SockAddr *sa,char *addr)

{
  addrinfo *__ai;
  int iVar1;
  long lVar2;
  string node;
  addrinfo *result;
  string service;
  long *local_98;
  long local_90;
  long local_88 [2];
  addrinfo local_78;
  addrinfo *local_48;
  char *local_40;
  undefined8 local_38;
  char local_30;
  undefined7 uStack_2f;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,addr,(allocator<char> *)&local_78);
  local_38 = 0;
  local_30 = '\0';
  local_40 = &local_30;
  lVar2 = std::__cxx11::string::find((char *)&local_98,0x10df2a,0);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_98);
    std::__cxx11::string::operator=((string *)&local_40,(string *)&local_78);
    if ((socklen_t *)CONCAT44(local_78.ai_family,local_78.ai_flags) != &local_78.ai_addrlen) {
      operator_delete((undefined1 *)CONCAT44(local_78.ai_family,local_78.ai_flags),
                      local_78._16_8_ + 1);
    }
    std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_98);
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_78);
    if ((socklen_t *)CONCAT44(local_78.ai_family,local_78.ai_flags) != &local_78.ai_addrlen) {
      operator_delete((undefined1 *)CONCAT44(local_78.ai_family,local_78.ai_flags),
                      local_78._16_8_ + 1);
    }
  }
  if ((sa->super_sockaddr_storage).ss_family != 10) {
    lVar2 = std::__cxx11::string::rfind((char)&local_98,0x3a);
    if (lVar2 != -1) {
      std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_98);
      std::__cxx11::string::operator=((string *)&local_40,(string *)&local_78);
      if ((socklen_t *)CONCAT44(local_78.ai_family,local_78.ai_flags) != &local_78.ai_addrlen) {
        operator_delete((undefined1 *)CONCAT44(local_78.ai_family,local_78.ai_flags),
                        local_78._16_8_ + 1);
      }
      std::__cxx11::string::resize((ulong)&local_98,(char)lVar2);
    }
  }
  local_48 = (addrinfo *)0x0;
  local_78.ai_socktype = 0;
  local_78.ai_protocol = 0;
  local_78.ai_addrlen = 0;
  local_78._20_4_ = 0;
  local_78.ai_addr = (sockaddr *)0x0;
  local_78.ai_canonname = (char *)0x0;
  local_78.ai_next = (addrinfo *)0x0;
  local_78.ai_flags = (local_90 == 0) + 0x28;
  local_78.ai_family = (int)(sa->super_sockaddr_storage).ss_family;
  iVar1 = getaddrinfo((char *)local_98,local_40,&local_78,&local_48);
  __ai = local_48;
  if (iVar1 == 0 && local_48 != (addrinfo *)0x0) {
    memcpy(sa,local_48->ai_addr,(ulong)local_48->ai_addrlen);
    freeaddrinfo(__ai);
  }
  if (local_40 != &local_30) {
    operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  return;
}

Assistant:

void SockAddr_set_Address(SockAddr *sa, const char *addr)
{
	std::string node = addr, service;
	size_t index;
	
	if ((index = node.find("://")) != std::string::npos)
	{
		service = node.substr(0, index);
		node = node.substr(index + 3);
	}
	
	if ((sa->ss_family != AF_INET6)
	&& ((index = node.rfind(':')) != std::string::npos))
	{
		service = node.substr(index + 1);
		node.resize(index);
	}
	
	addrinfo hint, *result = nullptr;
	memset(&hint, 0, sizeof (addrinfo));
	hint.ai_flags = AI_ADDRCONFIG | AI_V4MAPPED | (node.empty() ? AI_PASSIVE : 0);
	hint.ai_family = sa->ss_family ? sa->ss_family : AF_UNSPEC;
	
	if (getaddrinfo(node.c_str(), service.c_str(), &hint, &result) || !result)
	{
		// Handle error:
		// We'll simply do nothing when address resolving failed;
		// Users will figure out that the address object is empty,
		// so the address string supplied is most likely invalid.
		return;
	}

	memcpy(sa, result->ai_addr, result->ai_addrlen);
	freeaddrinfo(result);
}